

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  anon_struct_4_5_613047fb_for_header *this_00;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  int iVar6;
  Lit LVar8;
  vec<unsigned_int,_int> *pvVar9;
  int iVar10;
  int iVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  Queue<unsigned_int> *this_01;
  Var best;
  int local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  uint *local_58;
  undefined4 local_4c;
  Queue<unsigned_int> *local_48;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_40;
  ulong local_38;
  int iVar7;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,verbose);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x15a,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  this_01 = &this->subsumption_queue;
  local_40 = &this->occurs;
  local_60 = 0;
  local_64 = 0;
  local_5c = 0;
  local_48 = this_01;
  while( true ) {
    iVar6 = (this->subsumption_queue).end;
    iVar7 = 0;
    iVar11 = (this->subsumption_queue).first;
    iVar10 = iVar6 - iVar11;
    if (iVar6 < iVar11) {
      iVar7 = (this->subsumption_queue).buf.sz;
    }
    iVar6 = iVar7 + iVar10;
    if ((iVar6 == 0 || SCARRY4(iVar7,iVar10) != iVar6 < 0) &&
       ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
      return true;
    }
    if ((this->super_Solver).asynch_interrupt == true) {
      if ((this_01->buf).data != (uint *)0x0) {
        (this->subsumption_queue).buf.sz = 0;
      }
      vec<unsigned_int,_int>::growTo(&this_01->buf,1);
      (this->subsumption_queue).first = 0;
      (this->subsumption_queue).end = 0;
      this->bwdsub_assigns = (this->super_Solver).trail.sz;
      return true;
    }
    if (iVar6 == 0) {
      iVar6 = this->bwdsub_assigns;
      if (iVar6 < (this->super_Solver).trail.sz) {
        this->bwdsub_assigns = iVar6 + 1;
        if ((this->super_Solver).ca.ra.sz <= this->bwdsub_tmpunit) break;
        puVar13 = (this->super_Solver).ca.ra.memory;
        puVar13[(ulong)this->bwdsub_tmpunit + 1] = (this->super_Solver).trail.data[iVar6].x;
        if ((this->super_Solver).ca.ra.sz <= this->bwdsub_tmpunit) break;
        Clause::calcAbstraction((Clause *)(puVar13 + this->bwdsub_tmpunit));
        Queue<unsigned_int>::insert(this_01,this->bwdsub_tmpunit);
      }
    }
    iVar6 = (this->subsumption_queue).first;
    if (iVar6 == (this->subsumption_queue).end) {
      __assert_fail("first != end",
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Queue.h"
                    ,0x2f,"T Minisat::Queue<unsigned int>::peek() const [T = unsigned int]");
    }
    uVar2 = (this->subsumption_queue).buf.data[iVar6];
    uVar14 = (ulong)uVar2;
    Queue<unsigned_int>::pop(this_01);
    if ((this->super_Solver).ca.ra.sz <= uVar2) break;
    puVar13 = (this->super_Solver).ca.ra.memory;
    bVar5 = false;
    if ((puVar13[uVar14] & 3) == 0) {
      if ((((char)local_4c != '\0') && (1 < (this->super_Solver).verbosity)) &&
         (iVar6 = local_5c * 0x26e978d5, iVar11 = local_5c + 1, uVar2 = local_5c * -0x60000000,
         local_5c = iVar11, (iVar6 + 0x10624d8U >> 3 | uVar2) < 0x418937)) {
        iVar6 = (this->subsumption_queue).end;
        iVar7 = 0;
        iVar11 = (this->subsumption_queue).first;
        if (iVar6 < iVar11) {
          iVar7 = (this->subsumption_queue).buf.sz;
        }
        printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
               (ulong)(uint)((iVar6 - iVar11) + iVar7),(ulong)local_64,(ulong)local_60);
      }
      this_00 = (anon_struct_4_5_613047fb_for_header *)(puVar13 + uVar14);
      if ((uint)*this_00 < 0x40) {
        iVar6 = (int)this_00[1] >> 1;
        if ((this->super_Solver).assigns.
            super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar6) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        bVar1 = (this->super_Solver).assigns.
                super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data[iVar6].
                value;
        if (((SUB41(this_00[1],0) & 1 ^ bVar1) != l_True || (l_True & 2) != 0) &&
            (bVar1 & l_True & 2) == 0) {
          __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                        ,0x173,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
        }
      }
      local_68 = (int)this_00[1] >> 1;
      if (0x3f < (uint)*this_00) {
        iVar6 = (this->occurs).occs.map.sz;
        pvVar9 = (this->occurs).occs.map.data;
        uVar12 = 1;
        do {
          iVar11 = (int)puVar13[uVar14 + uVar12 + 1] >> 1;
          if ((iVar6 <= iVar11) || (iVar6 <= local_68)) {
            __assert_fail("has(k)",
                          "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                          ,0x28,
                          "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
                         );
          }
          if (pvVar9[iVar11].sz < pvVar9[local_68].sz) {
            local_68 = iVar11;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (uint)*this_00 >> 5);
      }
      pvVar9 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
               ::lookup(local_40,&local_68);
      if (0 < pvVar9->sz) {
        puVar13 = pvVar9->data;
        iVar6 = 0;
        local_58 = puVar13;
        local_38 = uVar14;
        do {
          if (((uint)*this_00 & 3) != 0) break;
          uVar2 = puVar13[iVar6];
          if ((this->super_Solver).ca.ra.sz <= uVar2) goto LAB_00111ae0;
          puVar4 = (this->super_Solver).ca.ra.memory;
          uVar3 = puVar4[uVar2];
          if ((((uVar3 & 3) == 0) && (uVar2 != (uint)uVar14)) &&
             ((this->subsumption_lim == -1 || ((int)(uVar3 >> 5) < this->subsumption_lim)))) {
            LVar8 = Clause::subsumes((Clause *)this_00,(Clause *)(puVar4 + uVar2));
            bVar5 = true;
            if (LVar8.x != -1) {
              if (LVar8.x == -2) {
                local_64 = local_64 + 1;
                removeClause(this,local_58[iVar6]);
              }
              else {
                local_60 = local_60 + 1;
                bVar5 = strengthenClause(this,local_58[iVar6],(Lit)(LVar8.x ^ 1));
                if (!bVar5) {
                  bVar5 = false;
                  goto LAB_00111a45;
                }
                iVar6 = iVar6 - (uint)(LVar8.x >> 1 == local_68);
              }
              bVar5 = true;
            }
LAB_00111a45:
            puVar13 = local_58;
            uVar14 = local_38;
            if (!bVar5) {
              bVar5 = true;
              this_01 = local_48;
              goto LAB_00111a67;
            }
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < pvVar9->sz);
      }
      bVar5 = false;
      this_01 = local_48;
    }
LAB_00111a67:
    if (bVar5) {
      return false;
    }
  }
LAB_00111ae0:
  __assert_fail("r < sz",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Alloc.h"
                ,0x3f,
                "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]");
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}